

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::synonym(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  Definition *pDVar5;
  size_type sVar6;
  Cell index;
  int __fd;
  char cVar7;
  string newWord;
  string currentWord;
  Definition definition;
  string local_c8;
  string local_a8;
  Definition local_88;
  
  requireDStackAvailable(this,1,"BL");
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::push(this_00,0x20);
  word(this);
  count(this);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar3 != 0) {
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    moveFromDataSpace(this,&local_c8,uVar4,(ulong)uVar3);
    requireDStackAvailable(this,1,"BL");
    __fd = 0x20;
    ForthStack<unsigned_int>::push(this_00,0x20);
    word(this);
    dup(this,__fd);
    count(this);
    uVar3 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    uVar4 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    if (uVar3 != 0) {
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      moveFromDataSpace(this,&local_a8,uVar4,(ulong)uVar3);
      find(this);
      uVar3 = ForthStack<unsigned_int>::getTop(this_00);
      ForthStack<unsigned_int>::pop(this_00);
      if (uVar3 == 0) {
        ForthStack<unsigned_int>::pop(this_00);
      }
      else {
        uVar3 = ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        pDVar5 = getDefinition(this,uVar3);
        local_88.code._0_4_ = (undefined4)pDVar5->code;
        local_88.code._4_4_ = *(undefined4 *)((long)&pDVar5->code + 4);
        local_88._8_4_ = *(undefined4 *)&pDVar5->field_0x8;
        local_88._12_4_ = *(undefined4 *)&pDVar5->field_0xc;
        local_88.does = pDVar5->does;
        local_88.parameter = pDVar5->parameter;
        local_88.flags = pDVar5->flags;
        local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
        pcVar2 = (pDVar5->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88.name,pcVar2,pcVar2 + (pDVar5->name)._M_string_length);
        local_88.numberInVector = pDVar5->numberInVector;
        local_88.searchOrder = pDVar5->searchOrder;
        local_88.FlagHidden = pDVar5->FlagHidden;
        local_88.FlagImmediate = pDVar5->FlagImmediate;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_88.name,&local_c8);
        if (local_88.name._M_string_length != 0) {
          sVar6 = 0;
          do {
            cVar1 = local_88.name._M_dataplus._M_p[sVar6];
            cVar7 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar7 = cVar1;
            }
            local_88.name._M_dataplus._M_p[sVar6] = cVar7;
            sVar6 = sVar6 + 1;
          } while (local_88.name._M_string_length != sVar6);
        }
        std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
        emplace_back<cppforth::Forth::Definition>(&this->definitions,&local_88);
        index = (int)((ulong)((long)(this->definitions).
                                    super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->definitions).
                                   super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 -
                1;
        pDVar5 = getDefinition(this,index);
        pDVar5->numberInVector = index;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void synonym() {
			bl(); word();
			count();
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			if (length > 0) {
				std::string newWord{};
				moveFromDataSpace(newWord, caddr, length);
				bl(); word(); dup();
				count();
				length = SIZE_T(dStack.getTop()); pop();
				caddr = CADDR(dStack.getTop()); pop();
				if (length > 0) {
					std::string currentWord{};
					moveFromDataSpace(currentWord, caddr, length);
					find();
					auto found = static_cast<int>(dStack.getTop()); pop();
					if (found) {
						auto xt = XT(dStack.getTop()); pop();
						auto definition = *getDefinition(xt);
						definition.name = newWord;
						for (auto & c: definition.name) c = toupper_ascii(static_cast<unsigned char>(c));
						definitions.emplace_back(std::move(definition));
						getDefinition(CELL(definitions.size()) - 1)->numberInVector = CELL(definitions.size()) - 1;
					}
					else {
						pop(); // remove from stack. not found , ambigous state
					}
				}

			}
		}